

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDepends.cxx
# Opt level: O0

void __thiscall cmDepends::cmDepends(cmDepends *this,cmLocalGenerator *lg,char *targetDir)

{
  char *pcVar1;
  allocator local_21;
  char *local_20;
  char *targetDir_local;
  cmLocalGenerator *lg_local;
  cmDepends *this_local;
  
  this->_vptr_cmDepends = (_func_int **)&PTR__cmDepends_00c48d60;
  local_20 = targetDir;
  targetDir_local = (char *)lg;
  lg_local = (cmLocalGenerator *)this;
  std::__cxx11::string::string((string *)&this->CompileDirectory);
  this->LocalGenerator = (cmLocalGenerator *)targetDir_local;
  this->Verbose = false;
  this->FileComparison = (cmFileTimeComparison *)0x0;
  std::__cxx11::string::string((string *)&this->Language);
  pcVar1 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->TargetDirectory,pcVar1,&local_21);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  this->MaxPath = 0x4000;
  pcVar1 = (char *)operator_new__(this->MaxPath);
  this->Dependee = pcVar1;
  pcVar1 = (char *)operator_new__(this->MaxPath);
  this->Depender = pcVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->IncludePath);
  return;
}

Assistant:

cmDepends::cmDepends(cmLocalGenerator* lg, const char* targetDir):
  CompileDirectory(),
  LocalGenerator(lg),
  Verbose(false),
  FileComparison(0),
  TargetDirectory(targetDir),
  MaxPath(16384),
  Dependee(new char[MaxPath]),
  Depender(new char[MaxPath])
{
}